

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O0

void __thiscall leveldb::CorruptionTest::CorruptionTest(CorruptionTest *this)

{
  Cache *pCVar1;
  Status local_20;
  allocator local_11;
  CorruptionTest *local_10;
  CorruptionTest *this_local;
  
  local_10 = this;
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__CorruptionTest_001f5c60;
  test::ErrorEnv::ErrorEnv(&this->env_);
  Options::Options(&this->options_);
  this->db_ = (DB *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->dbname_,"/memenv/corruption_test",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  pCVar1 = NewLRUCache(100);
  this->tiny_cache_ = pCVar1;
  (this->options_).env = (Env *)&this->env_;
  (this->options_).block_cache = this->tiny_cache_;
  DestroyDB((leveldb *)&local_20,&this->dbname_,&this->options_);
  Status::~Status(&local_20);
  (this->options_).create_if_missing = true;
  Reopen(this);
  (this->options_).create_if_missing = false;
  return;
}

Assistant:

CorruptionTest()
      : db_(nullptr),
        dbname_("/memenv/corruption_test"),
        tiny_cache_(NewLRUCache(100)) {
    options_.env = &env_;
    options_.block_cache = tiny_cache_;
    DestroyDB(dbname_, options_);

    options_.create_if_missing = true;
    Reopen();
    options_.create_if_missing = false;
  }